

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_context_enumerate_devices_sink_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pSinkInfo,int endOfList,
               void *pUserData)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  ma_device_info deviceInfo;
  char local_240 [256];
  char acStack_140 [304];
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pData != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4a60,
                  "void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
                 );
  }
  if ((endOfList == 0) && (*(int *)((long)pUserData + 0x18) == 0)) {
    memset(local_240,0,0x230);
    pcVar2 = pSinkInfo->name;
    if (pcVar2 != (char *)0x0) {
      lVar4 = 0;
      do {
        cVar1 = pcVar2[lVar4];
        if (cVar1 == '\0') goto LAB_0010e104;
        local_240[lVar4] = cVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xff);
      lVar4 = 0xff;
LAB_0010e104:
      local_240[lVar4] = '\0';
    }
    pcVar2 = pSinkInfo->description;
    if (pcVar2 != (char *)0x0) {
      lVar4 = 0;
      do {
        cVar1 = pcVar2[lVar4];
        if (cVar1 == '\0') goto LAB_0010e132;
        acStack_140[lVar4] = cVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xff);
      lVar4 = 0xff;
LAB_0010e132:
      acStack_140[lVar4] = '\0';
    }
    iVar3 = (**(code **)((long)pUserData + 8))
                      (*pUserData,1,local_240,*(undefined8 *)((long)pUserData + 0x10));
    *(uint *)((long)pUserData + 0x18) = (uint)(iVar3 == 0);
  }
  return;
}

Assistant:

static void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_sink_info* pSinkInfo, int endOfList, void* pUserData)
{
    ma_context_enumerate_devices_callback_data__pulse* pData = (ma_context_enumerate_devices_callback_data__pulse*)pUserData;
    ma_device_info deviceInfo;

    MA_ASSERT(pData != NULL);

    if (endOfList || pData->isTerminated) {
        return;
    }

    MA_ZERO_OBJECT(&deviceInfo);

    /* The name from PulseAudio is the ID for miniaudio. */
    if (pSinkInfo->name != NULL) {
        ma_strncpy_s(deviceInfo.id.pulse, sizeof(deviceInfo.id.pulse), pSinkInfo->name, (size_t)-1);
    }

    /* The description from PulseAudio is the name for miniaudio. */
    if (pSinkInfo->description != NULL) {
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), pSinkInfo->description, (size_t)-1);
    }

    pData->isTerminated = !pData->callback(pData->pContext, ma_device_type_playback, &deviceInfo, pData->pUserData);

    (void)pPulseContext; /* Unused. */
}